

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O0

void __thiscall
TPZFront<float>::STensorProductMTData::STensorProductMTData
          (STensorProductMTData *this,int nthreads,TPZFront<float> *frontMat)

{
  pair<int,_TPZFront<float>::STensorProductMTData_*> *this_00;
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar1;
  TPZFront<float> *in_RDX;
  int in_ESI;
  STensorProductMTData *in_RDI;
  int64_t in_stack_00000018;
  TPZVec<TPZSemaphore> *in_stack_00000020;
  STensorProductThreadData *threadData;
  int i;
  size_t in_stack_00000398;
  char *in_stack_000003a0;
  value_type *in_stack_ffffffffffffff78;
  TPZSemaphore *in_stack_ffffffffffffff80;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *this_02;
  STensorProductMTData *__f;
  TPZVec<TPZSemaphore> *this_03;
  int local_28;
  
  __f = in_RDI;
  TPZSemaphore::TPZSemaphore(in_stack_ffffffffffffff80);
  std::mutex::mutex((mutex *)0x1cc5570);
  this_03 = &__f->fWorkSem;
  TPZVec<TPZSemaphore>::TPZVec(this_03);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1cc559e);
  this_02 = &in_RDI->fThreadData;
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::TPZVec(this_02);
  if (in_RDX == (TPZFront<float> *)0x0) {
    pzinternal::DebugStopImpl(in_stack_000003a0,in_stack_00000398);
  }
  in_RDI->fMat = in_RDX;
  in_RDI->fRunning = true;
  TPZVec<TPZSemaphore>::Resize(in_stack_00000020,in_stack_00000018);
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::Resize
            ((TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *)in_RDI,
             (int64_t)this_02);
  for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
    this_00 = (pair<int,_TPZFront<float>::STensorProductMTData_*> *)operator_new(0x10);
    std::pair<int,_TPZFront<float>::STensorProductMTData_*>::
    pair<int,_TPZFront<float>::STensorProductMTData_*,_true>(this_00);
    this_00->first = local_28;
    this_00->second = in_RDI;
    pppVar1 = TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::operator[]
                        (&in_RDI->fThreadData,(long)local_28);
    *pppVar1 = this_00;
    this_01 = &in_RDI->fThreads;
    std::thread::
    thread<void*(&)(void*),std::pair<int,TPZFront<float>::STensorProductMTData*>*&,void>
              ((thread *)this_03,(_func_void_ptr_void_ptr *)__f,
               (pair<int,_TPZFront<float>::STensorProductMTData_*> **)in_RDI);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              (this_01,in_stack_ffffffffffffff78);
    std::thread::~thread((thread *)0x1cc5717);
  }
  return;
}

Assistant:

STensorProductMTData(int nthreads, TPZFront<TVar> * frontMat){
			if(!frontMat) DebugStop();
			this->fMat = frontMat;
			this->fRunning = true;
			
			fWorkSem.Resize(nthreads);
			
      // threads must be initialised already with thread work
			// fThreads.resize(nthreads);
			fThreadData.Resize(nthreads);
			for(int i = 0; i < nthreads; i++){
				STensorProductThreadData * threadData = new STensorProductThreadData;
				threadData->first = i;
				threadData->second = this;
				fThreadData[i] = threadData;
        fThreads.push_back(std::thread(Execute, threadData));
			}
		}